

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  long lVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  char *__last1;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  const_pointer result;
  const_pointer last;
  unsigned_long local_50;
  char *in_stack_ffffffffffffffc8;
  unsigned_long local_8;
  
  if ((ulong)in_RDI[1] < *(ulong *)(in_RSI + 8)) {
    local_8 = 0xffffffffffffffff;
  }
  else if (*(long *)(in_RSI + 8) == 0) {
    puVar2 = std::min<unsigned_long>
                       ((unsigned_long *)(in_RDI + 1),(unsigned_long *)&stack0xffffffffffffffe0);
    local_8 = *puVar2;
  }
  else {
    lVar1 = *in_RDI;
    pcVar3 = (char *)(in_RDI[1] - *(long *)(in_RSI + 8));
    puVar2 = std::min<unsigned_long>
                       ((unsigned_long *)&stack0xffffffffffffffd0,
                        (unsigned_long *)&stack0xffffffffffffffe0);
    __last1 = (char *)(lVar1 + *puVar2 + *(long *)(in_RSI + 8));
    pcVar3 = std::find_end<char_const*,char_const*>(in_RDX,__last1,pcVar3,in_stack_ffffffffffffffc8)
    ;
    if (pcVar3 == __last1) {
      local_50 = 0xffffffffffffffff;
    }
    else {
      local_50 = (long)pcVar3 - *in_RDI;
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (size_ < s.size_) return npos;
  if (s.size_ == 0) return std::min(size_, pos);
  const_pointer last = data_ + std::min(size_ - s.size_, pos) + s.size_;
  const_pointer result = std::find_end(data_, last, s.data_, s.data_ + s.size_);
  return result != last ? result - data_ : npos;
}